

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void __thiscall snestistics::LargeBitfield::read_file(LargeBitfield *this,FILE *f)

{
  ulong uVar1;
  uint32_t *puVar2;
  uint32_t local_1c;
  FILE *pFStack_18;
  uint32_t new_size;
  FILE *f_local;
  LargeBitfield *this_local;
  
  local_1c = 0;
  pFStack_18 = (FILE *)f;
  f_local = (FILE *)this;
  fread(&local_1c,4,1,(FILE *)f);
  if (local_1c != this->_num_elements) {
    if (this->_state != (uint32_t *)0x0) {
      operator_delete__(this->_state);
    }
    uVar1 = SUB168(ZEXT416(local_1c) * ZEXT816(4),0);
    if (SUB168(ZEXT416(local_1c) * ZEXT816(4),8) != 0) {
      uVar1 = 0xffffffffffffffff;
    }
    puVar2 = (uint32_t *)operator_new__(uVar1);
    this->_state = puVar2;
    this->_num_elements = local_1c;
  }
  fread(this->_state,4,(ulong)local_1c,pFStack_18);
  return;
}

Assistant:

void LargeBitfield::read_file(FILE * f) {
	uint32_t new_size = 0;
	fread(&new_size, sizeof(uint32_t), 1, f);

	if (new_size != _num_elements) {
		delete[] _state;
		_state = new uint32_t[new_size];
		_num_elements = new_size;
	}

	fread(_state, sizeof(uint32_t), new_size, f);
}